

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O3

Win __thiscall
adios2::helper::CommImplDummy::Win_allocate_shared
          (CommImplDummy *this,size_t size,int disp_unit,void *baseptr,string *param_4)

{
  __uniq_ptr_impl<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl =
       (tuple<adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>)
       operator_new(8);
  *(undefined ***)
   local_10._M_t.
   super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
   .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl =
       &PTR__CommWinImplDummy_0086b4d0;
  CommImpl::MakeWin(&this->super_CommImpl,
                    (unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
                     *)&local_10);
  if ((_Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
       )local_10._M_t.
        super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
        .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl !=
      (CommWinImpl *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
                          .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl
                + 8))();
  }
  return (unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
         )(unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
           )this;
}

Assistant:

Comm::Win CommImplDummy::Win_allocate_shared(size_t size, int disp_unit, void *baseptr,
                                             const std::string &) const
{
    auto win = std::unique_ptr<CommWinImplDummy>(new CommWinImplDummy());
    // TODO: How do you set the out pointer to NULL? baseptr = nullptr;
    return MakeWin(std::move(win));
}